

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O2

Request<capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionResults>
* __thiscall
capnproto_test::capnp::test::TestMoreStuff::Client::throwRemoteExceptionRequest
          (Request<capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  Maybe<capnp::MessageSize> local_20;
  
  local_20.ptr.isSet = (sizeHint->ptr).isSet;
  if (local_20.ptr.isSet == true) {
    local_20.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
    local_20.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionParams,capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionResults>
            (__return_storage_ptr__,(Client *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)),
             0xddc70bf9784133cf,0xf,&local_20,(CallHints)0x1);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionResults>
TestMoreStuff::Client::throwRemoteExceptionRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionResults>(
      0xddc70bf9784133cfull, 15, sizeHint, {true});
}